

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationWeights::incWeight(CollationWeights *this,uint32_t weight,int32_t length)

{
  uint32_t uVar1;
  int local_18;
  uint32_t byte;
  int32_t length_local;
  uint32_t weight_local;
  CollationWeights *this_local;
  
  local_18 = length;
  byte = weight;
  while( true ) {
    uVar1 = getWeightByte(byte,local_18);
    if (uVar1 < this->maxBytes[local_18]) break;
    byte = setWeightByte(byte,local_18,this->minBytes[local_18]);
    local_18 = local_18 + -1;
  }
  uVar1 = setWeightByte(byte,local_18,uVar1 + 1);
  return uVar1;
}

Assistant:

uint32_t
CollationWeights::incWeight(uint32_t weight, int32_t length) const {
    for(;;) {
        uint32_t byte=getWeightByte(weight, length);
        if(byte<maxBytes[length]) {
            return setWeightByte(weight, length, byte+1);
        } else {
            // Roll over, set this byte to the minimum and increment the previous one.
            weight=setWeightByte(weight, length, minBytes[length]);
            --length;
            U_ASSERT(length > 0);
        }
    }
}